

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_4::Validator::OnBrOnExnExpr(Validator *this,BrOnExnExpr *expr)

{
  Var local_b8;
  Var local_70;
  Enum local_24;
  BrOnExnExpr *local_20;
  BrOnExnExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (BrOnExnExpr *)this;
  Var::Var(&local_70,&expr->label_var);
  Var::Var(&local_b8,&local_20->event_var);
  local_24 = (Enum)SharedValidator::OnBrOnExn
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)11>).super_Expr.loc,&local_70,
                              &local_b8);
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_b8);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnBrOnExnExpr(BrOnExnExpr* expr) {
  result_ |= validator_.OnBrOnExn(expr->loc, expr->label_var,
                                  expr->event_var);
  return Result::Ok;
}